

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O2

void __thiscall
QTableViewPrivate::drawCell
          (QTableViewPrivate *this,QPainter *painter,QStyleOptionViewItem *option,QModelIndex *index
          )

{
  long lVar1;
  QWidget *this_00;
  QAbstractItemModel *pQVar2;
  bool bVar3;
  char cVar4;
  ulong uVar5;
  QStyle *pQVar6;
  long *plVar7;
  long in_FS_OFFSET;
  QModelIndex local_120;
  QStyleOptionViewItem opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  memset(&opt,0xaa,0xd0);
  QStyleOptionViewItem::QStyleOptionViewItem(&opt,option);
  bVar3 = QPointer::operator_cast_to_bool
                    ((QPointer *)&(this->super_QAbstractItemViewPrivate).selectionModel);
  if (bVar3) {
    cVar4 = QItemSelectionModel::isSelected
                      ((QModelIndex *)(this->super_QAbstractItemViewPrivate).selectionModel.wp.value
                      );
    if (cVar4 != '\0') {
      opt.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
      super_QFlagsStorage<QStyle::StateFlag>.i._1_1_ =
           opt.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
           super_QFlagsStorage<QStyle::StateFlag>.i._1_1_ | 0x80;
    }
  }
  cVar4 = ::comparesEqual(&(this->super_QAbstractItemViewPrivate).hover,index);
  if (cVar4 != '\0') {
    opt.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
    super_QFlagsStorage<QStyle::StateFlag>.i._1_1_ =
         opt.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
         super_QFlagsStorage<QStyle::StateFlag>.i._1_1_ | 0x20;
  }
  if (((option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
       super_QFlagsStorage<QStyle::StateFlag>.i & 1) != 0) {
    pQVar2 = (this->super_QAbstractItemViewPrivate).model;
    uVar5 = (**(code **)(*(long *)pQVar2 + 0x138))(pQVar2,index);
    bVar3 = (uVar5 & 0x20) == 0;
    if (bVar3) {
      opt.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
      super_QFlagsStorage<QStyle::StateFlag>.i._0_1_ =
           (byte)opt.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                 super_QFlagsStorage<QStyle::StateFlag>.i & 0xfe;
    }
    opt.super_QStyleOption.palette.currentGroup = (ColorGroup)bVar3;
  }
  QAbstractItemView::currentIndex(&local_120,(QAbstractItemView *)this_00);
  bVar3 = ::comparesEqual(index,&local_120);
  if (bVar3) {
    bVar3 = QWidget::hasFocus(this_00);
    if (!bVar3) {
      bVar3 = QWidget::hasFocus((this->super_QAbstractItemViewPrivate).
                                super_QAbstractScrollAreaPrivate.viewport);
      if (!bVar3) goto LAB_005292de;
    }
    QAbstractItemView::currentIndex(&local_120,(QAbstractItemView *)this_00);
    if (((-1 < local_120.r) && (-1 < local_120.c)) && (local_120.m.ptr != (QAbstractItemModel *)0x0)
       ) {
      opt.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
      super_QFlagsStorage<QStyle::StateFlag>.i._1_1_ =
           opt.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
           super_QFlagsStorage<QStyle::StateFlag>.i._1_1_ | 1;
    }
  }
LAB_005292de:
  pQVar6 = QWidget::style(this_00);
  (**(code **)(*(long *)pQVar6 + 0xb0))(pQVar6,0x2d,&opt,painter,this_00);
  plVar7 = (long *)(**(code **)(*(long *)this_00 + 0x208))(this_00,index);
  (**(code **)(*plVar7 + 0x60))(plVar7,painter,&opt,index);
  QStyleOptionViewItem::~QStyleOptionViewItem(&opt);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableViewPrivate::drawCell(QPainter *painter, const QStyleOptionViewItem &option, const QModelIndex &index)
{
    Q_Q(QTableView);
    QStyleOptionViewItem opt = option;

    if (selectionModel && selectionModel->isSelected(index))
        opt.state |= QStyle::State_Selected;
    if (index == hover)
        opt.state |= QStyle::State_MouseOver;
    if (option.state & QStyle::State_Enabled) {
        QPalette::ColorGroup cg;
        if ((model->flags(index) & Qt::ItemIsEnabled) == 0) {
            opt.state &= ~QStyle::State_Enabled;
            cg = QPalette::Disabled;
        } else {
            cg = QPalette::Normal;
        }
        opt.palette.setCurrentColorGroup(cg);
    }

    if (index == q->currentIndex()) {
        const bool focus = (q->hasFocus() || viewport->hasFocus()) && q->currentIndex().isValid();
        if (focus)
            opt.state |= QStyle::State_HasFocus;
    }

    q->style()->drawPrimitive(QStyle::PE_PanelItemViewRow, &opt, painter, q);

    q->itemDelegateForIndex(index)->paint(painter, opt, index);
}